

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool ON_GetViewportRotationAngles
               (ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z,double *angle1,double *angle2,
               double *angle3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double d;
  double dz;
  double dy;
  double dx;
  double eps;
  double cos_a3;
  double sin_a3;
  double cos_a2;
  double sin_a2;
  double cos_a1;
  double sin_a1;
  double *pdStack_38;
  bool bValidFrame;
  double *angle3_local;
  double *angle2_local;
  double *angle1_local;
  ON_3dVector *Z_local;
  ON_3dVector *Y_local;
  ON_3dVector *X_local;
  
  sin_a1._7_1_ = 0;
  cos_a1 = 0.0;
  sin_a2 = 1.0;
  cos_a2 = 0.0;
  sin_a3 = 1.0;
  cos_a3 = 0.0;
  eps = 1.0;
  pdStack_38 = angle3;
  angle3_local = angle2;
  angle2_local = angle1;
  angle1_local = &Z->x;
  Z_local = Y;
  Y_local = X;
  dVar1 = ON_3dVector::operator*(X,X);
  dVar2 = ON_3dVector::operator*(Z_local,Z_local);
  dVar3 = ON_3dVector::operator*((ON_3dVector *)angle1_local,(ON_3dVector *)angle1_local);
  if (((ABS(dVar1 - 1.0) <= 1.192092895508e-07) && (ABS(dVar2 - 1.0) <= 1.192092895508e-07)) &&
     (ABS(dVar3 - 1.0) <= 1.192092895508e-07)) {
    dVar1 = ON_3dVector::operator*(Y_local,Z_local);
    dVar2 = ON_3dVector::operator*(Z_local,(ON_3dVector *)angle1_local);
    dVar3 = ON_3dVector::operator*((ON_3dVector *)angle1_local,Y_local);
    if (((ABS(dVar1) <= 1.192092895508e-07) && (ABS(dVar2) <= 1.192092895508e-07)) &&
       (ABS(dVar3) <= 1.192092895508e-07)) {
      dVar1 = ON_TripleProduct(Y_local,Z_local,(ON_3dVector *)angle1_local);
      sin_a1._7_1_ = 0.0 < dVar1;
    }
  }
  if ((sin_a1._7_1_ & 1) != 0) {
    sin_a3 = angle1_local[2];
    cos_a2 = len2d(*angle1_local,angle1_local[1]);
    unitize2d(sin_a3,cos_a2,&sin_a3,&cos_a2);
    if (cos_a2 <= 0.0) {
      if ((sin_a3 != 1.0) || (NAN(sin_a3))) {
        if ((sin_a3 == -1.0) && (!NAN(sin_a3))) {
          eps = -Z_local->y;
          cos_a3 = Z_local->x;
        }
      }
      else {
        eps = Z_local->y;
        cos_a3 = -Z_local->x;
      }
    }
    else {
      cos_a1 = Y_local->z;
      sin_a2 = Z_local->z;
      unitize2d(sin_a2,cos_a1,&sin_a2,&cos_a1);
      eps = -angle1_local[1];
      cos_a3 = *angle1_local;
      unitize2d(eps,cos_a3,&eps,&cos_a3);
    }
  }
  if ((((sin_a2 == -1.0) && (!NAN(sin_a2))) && (cos_a1 == 0.0)) && (!NAN(cos_a1))) {
    cos_a1 = 0.0;
    sin_a2 = 0.0;
    cos_a2 = -cos_a2;
    cos_a3 = -cos_a3;
    eps = -eps;
  }
  if (angle2_local != (double *)0x0) {
    dVar1 = atan2(cos_a1,sin_a2);
    *angle2_local = dVar1;
  }
  if (angle3_local != (double *)0x0) {
    dVar1 = atan2(cos_a2,sin_a3);
    *angle3_local = dVar1;
  }
  if (pdStack_38 != (double *)0x0) {
    dVar1 = atan2(cos_a3,eps);
    *pdStack_38 = dVar1;
  }
  return (bool)(sin_a1._7_1_ & 1);
}

Assistant:

bool 
ON_GetViewportRotationAngles( 
    const ON_3dVector& X, // X,Y,Z must be a right handed orthonormal basis
    const ON_3dVector& Y, 
    const ON_3dVector& Z,
    double* angle1, // returns rotation about world Z
    double* angle2, // returns rotation about world X ( 0 <= a2 <= pi )
    double* angle3  // returns rotation about world Z
    )
{
  // double a1 = 0.0;  // rotation about world Z
  // double a2 = 0.0;  // rotation about world X ( 0 <= a2 <= pi )
  // double a3 = 0.0;  // rotation about world Z
  bool bValidFrame = false;
  double sin_a1 = 0.0;
  double cos_a1 = 1.0;
  double sin_a2 = 0.0;
  double cos_a2 = 1.0;
  double sin_a3 = 0.0;
  double cos_a3 = 1.0;

  // If si = sin(ai) and ci = cos(ai), then the relationship between the camera
  // frame and the angles is defined by the matrix equation C = R3*R2*R1, where:
  //
  //      c1 -s1  0        1   0   0         c3 -s3  0
  // R1 = s1  c1  0  R2 =  0  c2 -s2   R3 =  s3  c3  0
  //       0   0  1        0  s2  c2          0   0  1
  //
  //     CamX[0]  CamY[0] CamZ[0]
  // C = CamX[1]  CamY[1] CamZ[1]
  //     CamX[2]  CamY[2] CamZ[2]
  //
  //              .       .     s2*s3
  //
  // R3*R2*R1 =   .       .    -s2*c3
  //
  //            s1*s2   c1*s2    c2
  //

  {
    // don't attempt to work with slop
    const double eps = 8.0*ON_SQRT_EPSILON;
    double dx,dy,dz,d;
    dx = X*X;
    dy = Y*Y;
    dz = Z*Z;
    if ( fabs(dx-1.0) <= eps && fabs(dy-1.0) <= eps && fabs(dz-1.0) <= eps ) {
      dx = X*Y;
      dy = Y*Z;
      dz = Z*X;
      if ( fabs(dx) <= eps && fabs(dy) <= eps && fabs(dz) <= eps ) {
        d = ON_TripleProduct( X, Y, Z );
        bValidFrame = (d > 0.0);
      }
    }
  }

  if ( bValidFrame ) 
  {
    // Usually "Z" = opposite of unitized camera direction.
    //         "Y" = camera up made ortho to "Z" and unitized.
    //         "X" = YxZ.
    // So, when possible, I solve for angles in terms
    // of "Z" and "Y" since "X" will generally have the most noise.
    //         
    // Use C = R3*R2*R1 to get sin(a2), cos(a2).
    cos_a2 = Z.z;
    sin_a2 = len2d(Z.x,Z.y);
    unitize2d(cos_a2,sin_a2,&cos_a2,&sin_a2); // kill noise

    if ( sin_a2 > 0.0 ) {
      // use bottom row to get angle1.
      sin_a1 = X.z;
      cos_a1 = Y.z;
      unitize2d(cos_a1,sin_a1,&cos_a1,&sin_a1); // kill noise

      // use right column to get angle3
      cos_a3 = -Z.y;
      sin_a3 =  Z.x;
      unitize2d(cos_a3,sin_a3,&cos_a3,&sin_a3); // kill noise
    }
    else if ( cos_a2 == 1.0 ) {
      // R2 = identity and C determines (angle1+angle3)
      //      arbitrarily set angle1 = 0.
      cos_a3 =  Y.y; // = cos(angle3+angle1)
      sin_a3 = -Y.x; // = sin(angle3+angle1)
    }
    else if ( cos_a2 == -1.0 ) {
      // R2 = [1 0 0 / 0 -1 0/ 0 0 -1] and C determines (angle3-angle1)
      //      arbitrarily set angle1 = 0
      cos_a3 = -Y.y; // = cos(angle3-angle1)
      sin_a3 =  Y.x; // = sin(angle3-angle1)
    }
  }


  if ( cos_a1 == -1.0 && sin_a1 == 0.0 ) {
    // when a1 = pi, juggle angles to get a1 = 0 with
    // same effective rotation to keep legacy 3d apps
    // happy.
    // a1: pi -> 0
    // a2: a2 -> 2pi - a2
    // a1: a3 ->  pi + a3
    sin_a1 = 0.0;
    cos_a1 = 0.0;
    sin_a2 = -sin_a2;
    sin_a3 = -sin_a3;
    cos_a3 = -cos_a3;
  }
  
  if ( angle1 )
    *angle1 = atan2( sin_a1, cos_a1 );
  if ( angle2 )
    *angle2 = atan2( sin_a2, cos_a2 );
  if ( angle3 )
    *angle3 = atan2( sin_a3, cos_a3 );

  return bValidFrame;
}